

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O3

void __thiscall
binlog::PrettyPrinter::printTimeField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,BrokenDownTime *bdt,int tzoffset,
          char *tzname)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  size_t __n;
  byte bVar6;
  undefined7 in_register_00000011;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  char digits [2];
  char local_38;
  byte local_37;
  
  iVar8 = (int)CONCAT71(in_register_00000011,spec);
  if (iVar8 < 0x5a) {
    if (iVar8 < 0x4e) {
      if (iVar8 == 0x48) {
        lVar4 = (long)(bdt->super_tm).tm_hour;
      }
      else {
        if (iVar8 != 0x4d) goto LAB_0011230a;
        lVar4 = (long)(bdt->super_tm).tm_min;
      }
    }
    else {
      if (iVar8 == 0x4e) {
        __n = (size_t)(uint)bdt->tm_nsec;
        snprintf(&local_38,0x10,"%.9d");
        pvVar7 = (void *)0x9;
        goto LAB_001122ba;
      }
      if (iVar8 != 0x53) {
        if (iVar8 == 0x59) {
          detail::OstreamBuffer::writeSigned(out,(long)(bdt->super_tm).tm_year + 0x76c);
          return;
        }
LAB_0011230a:
        detail::OstreamBuffer::put(out,'%');
        detail::OstreamBuffer::put(out,spec);
        return;
      }
      lVar4 = (long)(bdt->super_tm).tm_sec;
    }
LAB_00112289:
    iVar8 = (int)((ulong)(lVar4 * 0x66666667) >> 0x20);
    uVar5 = (iVar8 >> 2) - (iVar8 >> 0x1f);
    uVar9 = (ulong)uVar5;
    cVar3 = (char)lVar4 + (char)uVar5 * -10;
LAB_001122a5:
    local_38 = (char)uVar9 + '0';
    __n = CONCAT71((int7)(uVar9 >> 8),local_38);
    local_37 = cVar3 + '0';
  }
  else {
    if (iVar8 < 0x6d) {
      if (iVar8 == 0x5a) {
        pvVar7 = (void *)strlen(tzname);
        detail::OstreamBuffer::write(out,(int)tzname,pvVar7,(size_t)bdt);
        return;
      }
      if (iVar8 != 100) goto LAB_0011230a;
      lVar4 = (long)(bdt->super_tm).tm_mday;
      goto LAB_00112289;
    }
    if (iVar8 != 0x6d) {
      if (iVar8 != 0x79) {
        if (iVar8 != 0x7a) goto LAB_0011230a;
        uVar9 = (ulong)(uint)-tzoffset;
        if (0 < tzoffset) {
          uVar9 = (ulong)(uint)tzoffset;
        }
        uVar5 = (uint)(uVar9 / 0xe10);
        iVar8 = uVar5 * -0x3c + (int)(uVar9 / 0x3c);
        detail::OstreamBuffer::put(out,(char)(tzoffset >> 0x1f) * -2 + '+');
        if (359999 < (uint)uVar9) {
          uVar5 = 0;
        }
        uVar2 = (uVar5 / 10) * 10;
        local_38 = (char)((ulong)uVar5 * 0x1999999a >> 0x20) + '0';
        local_37 = (char)uVar5 - (char)uVar2 | 0x30;
        detail::OstreamBuffer::write(out,(int)&local_38,(void *)0x2,(ulong)uVar2);
        if (99 < iVar8) {
          iVar8 = 0;
        }
        cVar3 = (char)(iVar8 / 10);
        local_38 = cVar3 + '0';
        __n = (size_t)CONCAT31((int3)((uint)(iVar8 / 10) >> 8),local_38);
        local_37 = (char)iVar8 + cVar3 * -10 + '0';
        goto LAB_001122b2;
      }
      iVar8 = (bdt->super_tm).tm_year;
      cVar3 = (char)iVar8 + (char)(iVar8 / 100) * -100;
      bVar6 = (char)((uint)(int)(short)(cVar3 * 0x67) >> 10) - (cVar3 >> 7);
      uVar9 = (ulong)bVar6;
      cVar3 = cVar3 + bVar6 * -10;
      goto LAB_001122a5;
    }
    iVar8 = (bdt->super_tm).tm_mon;
    iVar1 = (iVar8 + 1) / 10;
    cVar3 = (char)iVar1;
    local_38 = cVar3 + '0';
    __n = (size_t)CONCAT31((int3)((uint)iVar1 >> 8),local_38);
    local_37 = (char)iVar8 + cVar3 * -10 + '1';
  }
LAB_001122b2:
  pvVar7 = (void *)0x2;
LAB_001122ba:
  detail::OstreamBuffer::write(out,(int)&local_38,pvVar7,__n);
  return;
}

Assistant:

void PrettyPrinter::printTimeField(detail::OstreamBuffer& out, char spec, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  switch (spec)
  {
  case 'Y':
    out << bdt.tm_year + 1900;
    break;
  case 'y':
    printTwoDigits(out, bdt.tm_year % 100);
    break;
  case 'm':
    printTwoDigits(out, bdt.tm_mon + 1);
    break;
  case 'd':
    printTwoDigits(out, bdt.tm_mday);
    break;
  case 'H':
    printTwoDigits(out, bdt.tm_hour);
    break;
  case 'M':
    printTwoDigits(out, bdt.tm_min);
    break;
  case 'S':
    printTwoDigits(out, bdt.tm_sec);
    break;
  case 'z':
    printTimeZoneOffset(out, tzoffset);
    break;
  case 'Z':
    out << tzname;
    break;
  case 'N':
    printNineDigits(out, bdt.tm_nsec);
    break;
  default:
    out << '%' << spec;
    break;
  }
}